

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O1

gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table> __thiscall
mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>
          (gc_table *this,gc_heap *h,uint32_t capacity)

{
  slot *psVar1;
  undefined8 extraout_RDX;
  allocation_result aVar2;
  gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table> gVar3;
  
  if (capacity == 0) {
    __assert_fail("capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x65,
                  "static gc_heap_ptr<gc_table> mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::make(gc_heap &, uint32_t, Args &&...) [T = mjs::(anonymous namespace)::string_cache::entry, Args = <>]"
                 );
  }
  aVar2 = gc_heap::allocation_context::allocate(&h->alloc_context_,(ulong)capacity * 8 + 0x10);
  psVar1 = aVar2.obj;
  if (*(int *)((long)psVar1 + -4) == -1) {
    *psVar1 = (slot)h;
    psVar1[1].new_position = capacity;
    *(undefined4 *)((long)psVar1 + 0xc) = 0;
    *(undefined4 *)((long)psVar1 + -4) =
         gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table>
         ::reg._40_4_;
    this->heap_ = h;
    this->capacity_ = aVar2.pos;
    gc_heap::attach(h,(gc_heap_ptr_untyped *)this);
    gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    gVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table>)
           gVar3.super_gc_heap_ptr_untyped;
  }
  __assert_fail("a.hdr().type == uninitialized_type_index",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x1f9,
                "gc_heap_ptr<T> mjs::gc_heap::allocate_and_construct(size_t, Args &&...) [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table, Args = <mjs::gc_heap &, unsigned int &>]"
               );
}

Assistant:

static gc_heap_ptr<gc_table> make(gc_heap& h, uint32_t capacity, Args&&... args) {
            assert(capacity);
            return h.allocate_and_construct<gc_table>(sizeof(gc_table) + capacity * sizeof(T), h, capacity, std::forward<Args>(args)...);
        }